

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.cpp
# Opt level: O2

ssize_t __thiscall xmrig::Config::read(Config *this,int __fd,void *__buf,size_t __nbytes)

{
  ConfigPrivate *pCVar1;
  int iVar2;
  uint32_t uVar3;
  ulong uVar4;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  undefined4 in_register_00000034;
  long *plVar5;
  
  plVar5 = (long *)CONCAT44(in_register_00000034,__fd);
  uVar4 = BaseConfig::read(&this->super_BaseConfig,__fd,__buf,__nbytes);
  if ((char)uVar4 != '\0') {
    pCVar1 = this->d_ptr;
    iVar2 = (**(code **)(*plVar5 + 0x38))(plVar5,"cpu");
    CpuConfig::read(&pCVar1->cpu,iVar2,__buf_00,__nbytes);
    pCVar1 = this->d_ptr;
    iVar2 = (**(code **)(*plVar5 + 0x38))(plVar5,"opencl");
    OclConfig::read(&pCVar1->cl,iVar2,__buf_01,__nbytes);
    pCVar1 = this->d_ptr;
    iVar2 = (**(code **)(*plVar5 + 0x38))(plVar5,"cuda");
    CudaConfig::read(&pCVar1->cuda,iVar2,__buf_02,__nbytes);
    uVar3 = (**(code **)(*plVar5 + 0x58))(plVar5,"health-print-time",this->d_ptr->healthPrintTime);
    this->d_ptr->healthPrintTime = uVar3;
  }
  return uVar4 & 0xffffffff;
}

Assistant:

bool xmrig::Config::read(const IJsonReader &reader, const char *fileName)
{
    if (!BaseConfig::read(reader, fileName)) {
        return false;
    }

    d_ptr->cpu.read(reader.getValue(kCPU));

#   ifdef XMRIG_FEATURE_OPENCL
    d_ptr->cl.read(reader.getValue(kOcl));
#   endif

#   ifdef XMRIG_FEATURE_CUDA
    d_ptr->cuda.read(reader.getValue(kCuda));
#   endif

#   ifdef XMRIG_FEATURE_NVML
    d_ptr->healthPrintTime = reader.getUint(kHealthPrintTime, d_ptr->healthPrintTime);
#   endif

    return true;
}